

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libjsonnet.cpp
# Opt level: O1

JsonnetJsonValue * jsonnet_json_make_null(JsonnetVm *vm)

{
  _Rb_tree_header *p_Var1;
  JsonnetJsonValue *pJVar2;
  
  pJVar2 = (JsonnetJsonValue *)operator_new(0x78);
  *(undefined8 *)pJVar2 = 0;
  (pJVar2->string)._M_dataplus._M_p = (pointer)0x0;
  (pJVar2->string)._M_string_length = 0;
  (pJVar2->string).field_2._M_allocated_capacity = 0;
  (pJVar2->elements).
  super__Vector_base<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::allocator<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  *(undefined8 *)&(pJVar2->fields)._M_t._M_impl = 0;
  *(undefined8 *)&(pJVar2->fields)._M_t._M_impl.super__Rb_tree_header._M_header = 0;
  (pJVar2->fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pJVar2->fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = (_Base_ptr)0x0;
  (pJVar2->fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = (_Base_ptr)0x0;
  *(undefined8 *)((long)&(pJVar2->string).field_2 + 8) = 0;
  pJVar2->number = 0.0;
  (pJVar2->elements).
  super__Vector_base<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::allocator<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pJVar2->elements).
  super__Vector_base<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::allocator<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pJVar2->fields)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  p_Var1 = &(pJVar2->fields)._M_t._M_impl.super__Rb_tree_header;
  (pJVar2->string)._M_dataplus._M_p = (pointer)&(pJVar2->string).field_2;
  (pJVar2->string)._M_string_length = 0;
  (pJVar2->string).field_2._M_local_buf[0] = '\0';
  (pJVar2->elements).
  super__Vector_base<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>,_std::allocator<std::unique_ptr<JsonnetJsonValue,_std::default_delete<JsonnetJsonValue>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  (pJVar2->fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (pJVar2->fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (pJVar2->fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (pJVar2->fields)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  pJVar2->kind = NULL_KIND;
  return pJVar2;
}

Assistant:

JsonnetJsonValue *jsonnet_json_make_null(struct JsonnetVm *vm)
{
    (void)vm;
    JsonnetJsonValue *r = new JsonnetJsonValue();
    r->kind = JsonnetJsonValue::NULL_KIND;
    return r;
}